

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Quaternion QuaternionFromEuler(float pitch,float yaw,float roll)

{
  Quaternion QVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float z1;
  float z0;
  float y1;
  float y0;
  float x1;
  float x0;
  float roll_local;
  float yaw_local;
  float pitch_local;
  Quaternion q;
  
  fVar2 = cosf(pitch * 0.5);
  fVar3 = sinf(pitch * 0.5);
  fVar4 = cosf(yaw * 0.5);
  fVar5 = sinf(yaw * 0.5);
  fVar6 = cosf(roll * 0.5);
  fVar7 = sinf(roll * 0.5);
  QVar1.y = fVar2 * fVar5 * fVar6 + fVar3 * fVar4 * fVar7;
  QVar1.x = fVar3 * fVar4 * fVar6 - fVar2 * fVar5 * fVar7;
  QVar1.z = fVar2 * fVar4 * fVar7 - fVar3 * fVar5 * fVar6;
  QVar1.w = fVar2 * fVar4 * fVar6 + fVar3 * fVar5 * fVar7;
  return QVar1;
}

Assistant:

RMDEF Quaternion QuaternionFromEuler(float pitch, float yaw, float roll)
{
    Quaternion q = { 0 };

    float x0 = cosf(pitch*0.5f);
    float x1 = sinf(pitch*0.5f);
    float y0 = cosf(yaw*0.5f);
    float y1 = sinf(yaw*0.5f);
    float z0 = cosf(roll*0.5f);
    float z1 = sinf(roll*0.5f);

    q.x = x1*y0*z0 - x0*y1*z1;
    q.y = x0*y1*z0 + x1*y0*z1;
    q.z = x0*y0*z1 - x1*y1*z0;
    q.w = x0*y0*z0 + x1*y1*z1;

    return q;
}